

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::ShaderPackingFunctionTestInstance::~ShaderPackingFunctionTestInstance
          (ShaderPackingFunctionTestInstance *this)

{
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderPackingFunctionTestInstance_00c0e3a8;
  de::details::
  UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::~UniqueBase(&(this->m_executor).
                 super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
               );
  ShaderSpec::~ShaderSpec(&this->m_spec);
  return;
}

Assistant:

ShaderPackingFunctionTestInstance	(Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, const char* name)
											: TestInstance	(context)
											, m_testCtx		(context.getTestContext())
											, m_shaderType	(shaderType)
											, m_spec		(spec)
											, m_name		(name)
											, m_executor	(createExecutor(context, m_shaderType, m_spec))
										{
										}